

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
OpenMD::CubicSpline::sort_permutation(CubicSpline *this,vector<double,_std::allocator<double>_> *v)

{
  iterator __first;
  vector<double,_std::allocator<double>_> *in_RDX;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  vector<int,_std::allocator<int>_> *p;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first_00;
  anon_class_8_1_54a39816 __comp;
  size_type in_stack_ffffffffffffffa8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  allocator_type local_1a;
  undefined1 local_19;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  
  local_19 = 0;
  __first_00._M_current = in_RDI._M_current;
  local_18._M_current = (int *)in_RDX;
  std::vector<double,_std::allocator<double>_>::size(in_RDX);
  __comp.v = (vector<double,_std::allocator<double>_> *)&local_1a;
  std::allocator<int>::allocator((allocator<int> *)0x30caa2);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(allocator_type *)__comp.v);
  std::allocator<int>::~allocator((allocator<int> *)0x30cac2);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_RDI._M_current);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_RDI._M_current);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (__first_00,in_RDI,0);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_RDI._M_current);
  __first = std::vector<int,_std::allocator<int>_>::end(in_RDI._M_current);
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,OpenMD::CubicSpline::sort_permutation(std::vector<double,std::allocator<double>>const&)const::__0>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             local_18,__comp);
  return (vector<int,_std::allocator<int>_> *)in_RDI._M_current;
}

Assistant:

std::vector<int> CubicSpline::sort_permutation(
      const std::vector<double>& v) const {
    std::vector<int> p(v.size());

    std::iota(p.begin(), p.end(), 0);
    std::sort(p.begin(), p.end(), [&v](int a, int b) { return (v[a] < v[b]); });

    return p;
  }